

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::clear
          (array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_> *this)

{
  CLayerGroup **ppCVar1;
  
  if (this->list != (CLayerGroup **)0x0) {
    operator_delete__(this->list);
  }
  this->list_size = 1;
  ppCVar1 = (CLayerGroup **)operator_new__(8);
  this->list = ppCVar1;
  this->num_elements = 0;
  return;
}

Assistant:

void clear()
	{
		ALLOCATOR::free_array(list);
		list_size = 1;
		list = ALLOCATOR::alloc_array(list_size);
		num_elements = 0;
	}